

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *
gurkenlaeufer::getScenarios_abi_cxx11_(void)

{
  ParserStateFactory *this;
  element_type *this_00;
  list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *in_RDI;
  allocator local_81;
  string local_80;
  undefined1 local_59;
  shared_ptr<gurkenlaeufer::IScenarioCollection> local_58 [2];
  unique_ptr<gurkenlaeufer::IParserStateFactory,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  local_38;
  undefined1 local_30 [8];
  Parser parser;
  shared_ptr<gurkenlaeufer::ScenarioCollection> scenarios;
  
  std::make_shared<gurkenlaeufer::ScenarioCollection>();
  this = (ParserStateFactory *)operator_new(0x18);
  local_59 = 1;
  std::shared_ptr<gurkenlaeufer::IScenarioCollection>::
  shared_ptr<gurkenlaeufer::ScenarioCollection,void>
            (local_58,(shared_ptr<gurkenlaeufer::ScenarioCollection> *)&parser._currentState);
  ParserStateFactory::ParserStateFactory(this,local_58);
  local_59 = 0;
  std::
  unique_ptr<gurkenlaeufer::IParserStateFactory,std::default_delete<gurkenlaeufer::IParserStateFactory>>
  ::unique_ptr<std::default_delete<gurkenlaeufer::IParserStateFactory>,void>
            ((unique_ptr<gurkenlaeufer::IParserStateFactory,std::default_delete<gurkenlaeufer::IParserStateFactory>>
              *)&local_38,(pointer)this);
  Parser::Parser((Parser *)local_30,(IParserStateFactoryPtr *)&local_38);
  std::
  unique_ptr<gurkenlaeufer::IParserStateFactory,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  ::~unique_ptr(&local_38);
  std::shared_ptr<gurkenlaeufer::IScenarioCollection>::~shared_ptr(local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"addition.feature",&local_81);
  Parser::parseFile((Parser *)local_30,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  Parser::finish((Parser *)local_30);
  this_00 = std::
            __shared_ptr_access<gurkenlaeufer::ScenarioCollection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gurkenlaeufer::ScenarioCollection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&parser._currentState);
  ScenarioCollection::getScenarios_abi_cxx11_(in_RDI,this_00);
  Parser::~Parser((Parser *)local_30);
  std::shared_ptr<gurkenlaeufer::ScenarioCollection>::~shared_ptr
            ((shared_ptr<gurkenlaeufer::ScenarioCollection> *)&parser._currentState);
  return in_RDI;
}

Assistant:

std::list<gurkenlaeufer::Scenario> gurkenlaeufer::getScenarios()
{
    auto scenarios = std::make_shared<gurkenlaeufer::ScenarioCollection>();

    Parser parser(IParserStateFactoryPtr(new gurkenlaeufer::ParserStateFactory(scenarios)));
    parser.parseFile("addition.feature");
    parser.finish();

    return scenarios->getScenarios();
}